

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O2

JSONNode * __thiscall jsonChildren::operator[](jsonChildren *this,json_index_t position)

{
  uint uVar1;
  JSONNode **ppJVar2;
  allocator local_41;
  json_string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"Children is null []",&local_41);
  JSONDebug::_JSON_ASSERT(true,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  uVar1 = this->mysize;
  std::__cxx11::string::string((string *)&local_40,"Using [] out of bounds",&local_41);
  JSONDebug::_JSON_ASSERT(position < uVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  uVar1 = this->mycapacity;
  std::__cxx11::string::string((string *)&local_40,"Using [] out of bounds",&local_41);
  JSONDebug::_JSON_ASSERT(position < uVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  ppJVar2 = this->array;
  std::__cxx11::string::string((string *)&local_40,"Array is null",&local_41);
  JSONDebug::_JSON_ASSERT(ppJVar2 != (JSONNode **)0x0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return this->array[position];
}

Assistant:

inline JSONNode * operator[] (json_index_t position) const json_nothrow {
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null []"));
	   JSON_ASSERT(position < mysize, JSON_TEXT("Using [] out of bounds"));
	   JSON_ASSERT(position < mycapacity, JSON_TEXT("Using [] out of bounds"));
	   JSON_ASSERT(array != 0, JSON_TEXT("Array is null"));
	   return array[position];
    }